

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O0

word Extra_Truth6MinimumRoundOne(word t,int iVar,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  word wVar2;
  word wVar3;
  uint local_44;
  ulong uStack_40;
  uint info;
  word tMin;
  word tCur;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int iVar_local;
  word t_local;
  
  if ((-1 < iVar) && (iVar < 5)) {
    wVar2 = Extra_Truth6ChangePhase(t,iVar);
    uStack_40 = t;
    if (wVar2 < t) {
      uStack_40 = wVar2;
    }
    local_44 = (uint)(wVar2 < t);
    wVar2 = Extra_Truth6ChangePhase(t,iVar + 1);
    if (wVar2 < uStack_40) {
      local_44 = 2;
      uStack_40 = wVar2;
    }
    wVar2 = Extra_Truth6ChangePhase(wVar2,iVar);
    if (wVar2 < uStack_40) {
      local_44 = 3;
      uStack_40 = wVar2;
    }
    wVar2 = Extra_Truth6SwapAdjacent(t,iVar);
    if (wVar2 < uStack_40) {
      local_44 = 4;
      uStack_40 = wVar2;
    }
    wVar3 = Extra_Truth6ChangePhase(wVar2,iVar);
    if (wVar3 < uStack_40) {
      local_44 = 6;
      uStack_40 = wVar3;
    }
    wVar2 = Extra_Truth6ChangePhase(wVar2,iVar + 1);
    if (wVar2 < uStack_40) {
      local_44 = 5;
      uStack_40 = wVar2;
    }
    t_local = Extra_Truth6ChangePhase(wVar2,iVar);
    if (t_local < uStack_40) {
      uVar1 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,7);
      *pCanonPhase = uVar1;
    }
    else {
      uVar1 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,local_44);
      *pCanonPhase = uVar1;
      t_local = uStack_40;
    }
    return t_local;
  }
  __assert_fail("iVar >= 0 && iVar < 5",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast6.c"
                ,0x69,"word Extra_Truth6MinimumRoundOne(word, int, char *, unsigned int *)");
}

Assistant:

word Extra_Truth6MinimumRoundOne( word t, int iVar, char* pCanonPerm, unsigned* pCanonPhase )
{
    word tCur, tMin = t; // ab 
    unsigned info =0;
    assert( iVar >= 0 && iVar < 5 );
    
    tCur = Extra_Truth6ChangePhase( t, iVar );    // !a b
    if(tCur<tMin)
    {
        info = 1;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( t, iVar+1 );  // a !b
    if(tCur<tMin)
    {
        info = 2;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( tCur, iVar ); // !a !b
    if(tCur<tMin)
    {
        info = 3;
        tMin = tCur;
    }
    
    t    = Extra_Truth6SwapAdjacent( t, iVar );   // b a
    if(t<tMin)
    {
        info = 4;
        tMin = t;
    }
    
    tCur = Extra_Truth6ChangePhase( t, iVar );    // !b a
    if(tCur<tMin)
    {
        info = 6;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( t, iVar+1 );  // b !a
    if(tCur<tMin)
    {
        info = 5;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( tCur, iVar ); // !b !a
    if(tCur<tMin)
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, 7);
        return tCur;
    }
    else
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, info);
        return tMin;
    }
}